

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

FieldDescriptor ** google::protobuf::compiler::java::SortFieldsByNumber(Descriptor *descriptor)

{
  FieldDescriptor **ppFVar1;
  FieldDescriptor *pFVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  uVar4 = (ulong)descriptor->field_count_;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (long)uVar4) {
    uVar3 = uVar4 * 8;
  }
  ppFVar1 = (FieldDescriptor **)operator_new__(uVar3);
  for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
    pFVar2 = Descriptor::field(descriptor,(int)lVar5);
    ppFVar1[lVar5] = pFVar2;
    uVar4 = (ulong)(uint)descriptor->field_count_;
  }
  std::
  __sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::FieldOrderingByNumber>>
            (ppFVar1,ppFVar1 + (int)uVar4);
  return ppFVar1;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
      new const FieldDescriptor*[descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  std::sort(fields, fields + descriptor->field_count(),
            FieldOrderingByNumber());
  return fields;
}